

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_transform_output_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar18;
  int iVar19;
  void *pvVar20;
  float *pfVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  void *pvVar25;
  void *pvVar26;
  float *pfVar27;
  void *pvVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  void *pvVar33;
  void *pvVar34;
  void *pvVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  float tmp [6] [8];
  float *local_1f0;
  long local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  float *local_1a8;
  long local_1a0;
  void *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  float afStack_f8 [3];
  ulong auStack_ec [2];
  float afStack_dc [43];
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->h;
    uVar17 = iVar4 / 6;
    iVar5 = top_blob->w;
    uVar18 = iVar5 / 6;
    iVar19 = uVar17 * uVar18;
    pvVar6 = top_blob_tm->data;
    sVar7 = top_blob->elemsize;
    lVar29 = top_blob_tm->cstep * top_blob_tm->elemsize;
    sVar8 = top_blob->cstep;
    local_1b0 = (void *)((long)pvVar6 + (long)iVar19 * 4);
    local_1b8 = (void *)((long)pvVar6 + (long)(iVar19 * 2) * 4);
    local_1c0 = (void *)((long)pvVar6 + (long)(iVar19 * 3) * 4);
    local_1c8 = (void *)((long)pvVar6 + (long)(iVar19 * 4) * 4);
    local_1d0 = (void *)((long)pvVar6 + (long)(iVar19 * 5) * 4);
    local_1d8 = (void *)((long)pvVar6 + (long)(iVar19 * 6) * 4);
    local_1e0 = (void *)((long)pvVar6 + (long)(iVar19 * 7) * 4);
    local_1a8 = (float *)((long)top_blob->data + 0x14);
    auVar45 = ZEXT1664(_DAT_005306b0);
    lVar1 = (ulong)uVar18 * 4;
    local_1e8 = 0;
    lVar23 = 0;
    do {
      if (bias == (Mat *)0x0) {
        fVar40 = 0.0;
      }
      else {
        fVar40 = *(float *)((long)&bias->data + lVar23 * 4);
      }
      if (5 < iVar4) {
        local_1f0 = local_1a8;
        local_168 = local_1e0;
        local_170 = local_1d8;
        local_178 = local_1d0;
        local_180 = local_1c8;
        local_188 = local_1c0;
        local_190 = local_1b8;
        local_198 = local_1b0;
        local_1a0 = local_1e8;
        uVar22 = 0;
        do {
          if (5 < iVar5) {
            uVar32 = 0;
            pvVar20 = local_178;
            lVar24 = local_1a0;
            pvVar25 = local_180;
            pvVar26 = local_190;
            pfVar27 = local_1f0;
            pvVar28 = local_198;
            pvVar33 = local_188;
            pvVar34 = local_168;
            pvVar35 = local_170;
            do {
              lVar30 = -8;
              lVar31 = 0;
              do {
                fVar9 = *(float *)((long)pvVar26 + lVar31) + *(float *)((long)pvVar28 + lVar31);
                fVar13 = *(float *)((long)pvVar28 + lVar31) - *(float *)((long)pvVar26 + lVar31);
                fVar10 = *(float *)((long)pvVar25 + lVar31) + *(float *)((long)pvVar33 + lVar31);
                fVar14 = *(float *)((long)pvVar33 + lVar31) - *(float *)((long)pvVar25 + lVar31);
                fVar11 = *(float *)((long)pvVar35 + lVar31) + *(float *)((long)pvVar20 + lVar31);
                fVar15 = *(float *)((long)pvVar20 + lVar31) - *(float *)((long)pvVar35 + lVar31);
                auVar36 = SUB6416(ZEXT464(0x42000000),0);
                auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 + fVar9 +
                                                        *(float *)((long)pvVar6 + lVar31 + lVar24)))
                                          ,ZEXT416((uint)fVar11),auVar36);
                afStack_dc[lVar30 + 1] = auVar16._0_4_;
                auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar10),
                                          ZEXT416((uint)fVar9));
                auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar11),
                                          SUB6416(ZEXT464(0x41000000),0));
                afStack_dc[lVar30 + 0x11] = auVar16._0_4_;
                auVar37 = SUB6416(ZEXT464(0x41800000),0);
                auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar10),auVar37,ZEXT416((uint)fVar9));
                auVar38 = SUB6416(ZEXT464(0x40000000),0);
                auVar16 = vfmadd231ss_fma(auVar16,auVar38,ZEXT416((uint)fVar11));
                afStack_dc[lVar30 + 0x21] = auVar16._0_4_;
                auVar16 = vfmadd213ss_fma(auVar38,ZEXT416((uint)fVar14),ZEXT416((uint)fVar13));
                auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar15),auVar37);
                afStack_dc[lVar30 + 9] = auVar16._0_4_;
                auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41000000),0),ZEXT416((uint)fVar14),
                                          ZEXT416((uint)fVar13));
                auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar15),
                                          SUB6416(ZEXT464(0x40800000),0));
                afStack_dc[lVar30 + 0x19] = auVar16._0_4_;
                auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar14),auVar36,ZEXT416((uint)fVar13));
                afStack_dc[lVar30 + 0x29] =
                     auVar16._0_4_ + fVar15 + *(float *)((long)pvVar34 + lVar31);
                lVar31 = lVar31 + (long)(iVar19 * 8) * 4;
                lVar30 = lVar30 + 1;
              } while (lVar30 != 0);
              lVar30 = 0;
              pfVar21 = pfVar27;
              do {
                fVar9 = *(float *)((long)afStack_f8 + lVar30 + 4);
                fVar10 = *(float *)((long)afStack_f8 + lVar30 + 8);
                fVar11 = fVar10 + fVar9 + fVar40;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = *(ulong *)((long)auStack_ec + lVar30);
                auVar39 = vhaddps_avx(auVar42,auVar42);
                auVar16 = vshufps_avx(auVar42,auVar42,0xe1);
                auVar12 = vsubps_avx(auVar16,auVar42);
                auVar16 = vblendps_avx(auVar39,auVar12,2);
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *(ulong *)((long)auStack_ec + lVar30 + 8);
                auVar41 = vhaddps_avx(auVar43,auVar43);
                auVar42 = vshufps_avx(auVar43,auVar43,0xe1);
                auVar43 = vsubps_avx(auVar42,auVar43);
                auVar42 = vblendps_avx(auVar41,auVar43,2);
                auVar44._0_8_ = auVar42._0_8_;
                auVar44._8_8_ = auVar44._0_8_;
                auVar42 = vfmadd132ss_fma(auVar39,ZEXT416((uint)fVar11),auVar37);
                auVar42 = vfmadd231ss_fma(auVar42,auVar41,auVar38);
                uVar2 = *(uint *)((long)afStack_f8 + lVar30);
                pfVar21[-1] = auVar42._0_4_;
                auVar41 = ZEXT416((uint)((fVar9 - fVar10) + fVar40));
                auVar42 = vinsertps_avx(ZEXT416(uVar2),auVar41,0x10);
                auVar42 = vinsertps_avx(auVar42,ZEXT416((uint)fVar11),0x20);
                auVar42 = vshufps_avx(auVar42,auVar42,100);
                auVar39._0_4_ = auVar42._0_4_ + auVar39._0_4_ + fVar11;
                auVar39._4_4_ = auVar42._4_4_ + auVar16._4_4_ * 2.0;
                auVar39._8_4_ = auVar42._8_4_ + auVar16._0_4_ * 0.0;
                auVar39._12_4_ = auVar42._12_4_ + auVar16._4_4_ * 8.0;
                auVar16 = vfmadd231ps_fma(auVar39,auVar44,auVar45._0_16_);
                auVar45 = ZEXT1664(auVar45._0_16_);
                *(undefined1 (*) [16])(pfVar21 + -5) = auVar16;
                auVar16 = vmovshdup_avx(auVar12);
                auVar42 = vfmadd132ss_fma(auVar16,auVar41,auVar36);
                auVar16 = vmovshdup_avx(auVar43);
                *pfVar21 = auVar16._0_4_ + auVar42._0_4_ + *(float *)((long)afStack_dc + lVar30);
                lVar30 = lVar30 + 0x20;
                pfVar21 = pfVar21 + iVar5;
              } while (lVar30 != 0xc0);
              uVar32 = uVar32 + 1;
              lVar24 = lVar24 + 4;
              pvVar28 = (void *)((long)pvVar28 + 4);
              pvVar26 = (void *)((long)pvVar26 + 4);
              pvVar33 = (void *)((long)pvVar33 + 4);
              pvVar25 = (void *)((long)pvVar25 + 4);
              pvVar20 = (void *)((long)pvVar20 + 4);
              pvVar35 = (void *)((long)pvVar35 + 4);
              pvVar34 = (void *)((long)pvVar34 + 4);
              pfVar27 = pfVar27 + 6;
            } while (uVar32 != uVar18);
          }
          uVar22 = uVar22 + 1;
          local_1a0 = local_1a0 + lVar1;
          local_198 = (void *)((long)local_198 + lVar1);
          local_190 = (void *)((long)local_190 + lVar1);
          local_188 = (void *)((long)local_188 + lVar1);
          local_180 = (void *)((long)local_180 + lVar1);
          local_178 = (void *)((long)local_178 + lVar1);
          local_170 = (void *)((long)local_170 + lVar1);
          local_168 = (void *)((long)local_168 + lVar1);
          local_1f0 = (float *)((long)local_1f0 + sVar7 * (long)iVar5 * 6);
        } while (uVar22 != uVar17);
      }
      lVar23 = lVar23 + 1;
      local_1e8 = local_1e8 + lVar29;
      local_1b0 = (void *)((long)local_1b0 + lVar29);
      local_1b8 = (void *)((long)local_1b8 + lVar29);
      local_1c0 = (void *)((long)local_1c0 + lVar29);
      local_1c8 = (void *)((long)local_1c8 + lVar29);
      local_1d0 = (void *)((long)local_1d0 + lVar29);
      local_1d8 = (void *)((long)local_1d8 + lVar29);
      local_1e0 = (void *)((long)local_1e0 + lVar29);
      local_1a8 = (float *)((long)local_1a8 + sVar7 * sVar8);
    } while (lVar23 != iVar3);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_output_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 6;
    const int h_tiles = outh / 6;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[6][8] = {
    //     {1.0f,  1.0f,   1.0f,   1.0f,   1.0f,  32.0f, 32.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   2.0f,  -2.0f,  16.0f,-16.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,   4.0f,   4.0f,   8.0f,  8.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   8.0f,  -8.0f,   4.0f, -4.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,  16.0f,  16.0f,   2.0f,  2.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,  32.0f, -32.0f,   1.0f, -1.0f, 1.0f}
    // };

    // 0 = r0 + (r1 + r2) + (r3 + r4)     + (r5 + r6) * 32
    // 1 =      (r1 - r2) + (r3 - r4) * 2 + (r5 - r6) * 16
    // 2 =      (r1 + r2) + (r3 + r4) * 4 + (r5 + r6) * 8
    // 3 =      (r1 - r2) + (r3 - r4) * 8 + (r5 - r6) * 4
    // 4 =      (r1 + r2) + (r3 + r4) * 16+ (r5 + r6) * 2
    // 5 = r7 + (r1 - r2) + (r3 - r4) * 32+ (r5 - r6)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        const float bias0 = biasptr ? biasptr[p] : 0.f;

        float tmp[6][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 1;
                const float* output0_tm_1 = output0_tm_0 + tiles * 1;
                const float* output0_tm_2 = output0_tm_0 + tiles * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 5;
                const float* output0_tm_6 = output0_tm_0 + tiles * 6;
                const float* output0_tm_7 = output0_tm_0 + tiles * 7;

                // TODO sse optimize
                for (int m = 0; m < 8; m++)
                {
                    float tmp024a = output0_tm_1[0] + output0_tm_2[0];
                    float tmp135a = output0_tm_1[0] - output0_tm_2[0];

                    float tmp024b = output0_tm_3[0] + output0_tm_4[0];
                    float tmp135b = output0_tm_3[0] - output0_tm_4[0];

                    float tmp024c = output0_tm_5[0] + output0_tm_6[0];
                    float tmp135c = output0_tm_5[0] - output0_tm_6[0];

                    tmp[0][m] = output0_tm_0[0] + tmp024a + tmp024b + tmp024c * 32;
                    tmp[2][m] = tmp024a + tmp024b * 4 + tmp024c * 8;
                    tmp[4][m] = tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    tmp[1][m] = tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    tmp[3][m] = tmp135a + tmp135b * 8 + tmp135c * 4;
                    tmp[5][m] = output0_tm_7[0] + tmp135a + tmp135b * 32 + tmp135c;

                    output0_tm_0 += tiles * 8;
                    output0_tm_1 += tiles * 8;
                    output0_tm_2 += tiles * 8;
                    output0_tm_3 += tiles * 8;
                    output0_tm_4 += tiles * 8;
                    output0_tm_5 += tiles * 8;
                    output0_tm_6 += tiles * 8;
                    output0_tm_7 += tiles * 8;
                }

                float* output0 = out0.row(i * 6) + j * 6;

                for (int m = 0; m < 6; m++)
                {
                    const float* tmp0 = tmp[m];

                    float tmp024a = tmp0[1] + tmp0[2];
                    float tmp135a = tmp0[1] - tmp0[2];

                    float tmp024b = tmp0[3] + tmp0[4];
                    float tmp135b = tmp0[3] - tmp0[4];

                    float tmp024c = tmp0[5] + tmp0[6];
                    float tmp135c = tmp0[5] - tmp0[6];

                    output0[0] = bias0 + tmp0[0] + tmp024a + tmp024b + tmp024c * 32;
                    output0[2] = bias0 + tmp024a + tmp024b * 4 + tmp024c * 8;
                    output0[4] = bias0 + tmp024a + tmp024b * 16 + tmp024c + tmp024c;

                    output0[1] = bias0 + tmp135a + tmp135b + tmp135b + tmp135c * 16;
                    output0[3] = bias0 + tmp135a + tmp135b * 8 + tmp135c * 4;
                    output0[5] = bias0 + tmp0[7] + tmp135a + tmp135b * 32 + tmp135c;

                    output0 += outw;
                }
            }
        }
    }
}